

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::onSubscriptionReady
          (ClientConductor *this,int64_t registrationId,int32_t channelStatusId)

{
  _Atomic_word *p_Var1;
  pointer pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  int iVar4;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Subscription *__tmp;
  pointer pSVar6;
  long lVar7;
  long lVar8;
  pointer __args_2;
  int32_t local_4c;
  __weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> local_48;
  int32_t channelStatusId_local;
  
  channelStatusId_local = channelStatusId;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  pSVar6 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pSVar2 - (long)pSVar6;
  lVar7 = (lVar8 >> 6) * -0x5555555555555555 >> 2;
  if (0 < lVar7) {
    lVar8 = lVar7 + 1;
    __args_2 = pSVar6 + 2;
    do {
      if (__args_2[-2].m_registrationId == registrationId) {
        __args_2 = __args_2 + -2;
        goto LAB_00140e6d;
      }
      if (__args_2[-1].m_registrationId == registrationId) {
        __args_2 = __args_2 + -1;
        goto LAB_00140e6d;
      }
      if (__args_2->m_registrationId == registrationId) goto LAB_00140e6d;
      if (__args_2[1].m_registrationId == registrationId) {
        __args_2 = __args_2 + 1;
        goto LAB_00140e6d;
      }
      lVar8 = lVar8 + -1;
      __args_2 = __args_2 + 4;
    } while (1 < lVar8);
    lVar8 = (long)pSVar2 - (long)(pSVar6 + lVar7 * 4);
    pSVar6 = pSVar6 + lVar7 * 4;
  }
  lVar7 = (lVar8 >> 6) * -0x5555555555555555;
  if (lVar7 == 1) {
LAB_00140e47:
    __args_2 = pSVar6;
    if (pSVar6->m_registrationId != registrationId) {
      __args_2 = pSVar2;
    }
  }
  else if (lVar7 == 2) {
LAB_00140e3a:
    __args_2 = pSVar6;
    if (pSVar6->m_registrationId != registrationId) {
      pSVar6 = pSVar6 + 1;
      goto LAB_00140e47;
    }
  }
  else {
    if (lVar7 != 3) goto LAB_00140fa2;
    __args_2 = pSVar6;
    if (pSVar6->m_registrationId != registrationId) {
      pSVar6 = pSVar6 + 1;
      goto LAB_00140e3a;
    }
  }
LAB_00140e6d:
  if ((__args_2 != pSVar2) && (__args_2->m_status == AWAITING_MEDIA_DRIVER)) {
    __args_2->m_status = REGISTERED_MEDIA_DRIVER;
    local_48._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<aeron::Subscription,std::allocator<aeron::Subscription>,aeron::ClientConductor&,long&,std::__cxx11::string&,int&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_refcount,&local_48._M_ptr,
               (allocator<aeron::Subscription> *)&local_4c,this,&__args_2->m_registrationId,
               &__args_2->m_channel,&__args_2->m_streamId,&channelStatusId_local);
    _Var5._M_pi = local_48._M_refcount._M_pi;
    peVar3 = local_48._M_ptr;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__args_2->m_subscriptionCache).
    super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
    this_00 = (__args_2->m_subscriptionCache).
              super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (__args_2->m_subscriptionCache).
    super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var5._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_refcount._M_pi);
      }
      _Var5._M_pi = (__args_2->m_subscriptionCache).
                    super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
    }
    local_48._M_ptr =
         (__args_2->m_subscriptionCache).
         super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var5._M_pi)->_M_weak_count = (_Var5._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (_Var5._M_pi)->_M_weak_count = (_Var5._M_pi)->_M_weak_count + 1;
      }
    }
    local_48._M_refcount._M_pi = _Var5._M_pi;
    std::__weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__args_2->m_subscription).
                super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_48._M_refcount._M_pi)->_M_weak_count;
        iVar4 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = (local_48._M_refcount._M_pi)->_M_weak_count;
        (local_48._M_refcount._M_pi)->_M_weak_count = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*(local_48._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    local_4c = __args_2->m_streamId;
    local_48._M_ptr = (element_type *)registrationId;
    if ((this->m_onNewSubscriptionHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_onNewSubscriptionHandler)._M_invoker)
              ((_Any_data *)&this->m_onNewSubscriptionHandler,&__args_2->m_channel,&local_4c,
               (long *)&local_48);
  }
LAB_00140fa2:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onSubscriptionReady(
    std::int64_t registrationId,
    std::int32_t channelStatusId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto subIt = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (subIt != m_subscriptions.end() && (*subIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        SubscriptionStateDefn& state = (*subIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_subscriptionCache = std::make_shared<Subscription>(
            *this, state.m_registrationId, state.m_channel, state.m_streamId, channelStatusId);
        state.m_subscription = std::weak_ptr<Subscription>(state.m_subscriptionCache);
        m_onNewSubscriptionHandler(state.m_channel, state.m_streamId, registrationId);
        return;
    }
}